

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O1

transaction_base * __thiscall pstore::transaction_base::rollback(transaction_base *this)

{
  if ((this->first_).a_ != 0) {
    (this->first_).a_ = 0;
    if (this->dbsize_ < (this->db_->size_).logical_) {
      (*this->db_->_vptr_database[5])();
      if ((this->db_->size_).logical_ != this->dbsize_) {
        assert_failed("db_.size () == dbsize_",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/transaction.cpp"
                      ,0x9a);
      }
    }
  }
  return this;
}

Assistant:

transaction_base & transaction_base::rollback () noexcept {
        if (this->is_open ()) {
            first_ = address::null ();
            PSTORE_ASSERT (!this->is_open ()); //! OCLINT(PH - don't warn about the assert macro)
            // if we grew the db, truncate it back
            if (db_.size () > dbsize_) {
                db_.truncate (dbsize_);
                PSTORE_ASSERT (db_.size () == dbsize_);
            }
        }
        return *this;
    }